

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void dw3_male_wizard(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4,3);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8,3);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39);
  vpatch(rom,0x1a8b,3,0x36,0x30,0x11);
  vpatch(rom,0x12300,0x80,0,3,3,0x47,0xe7,0x41,0x5f,0xe,0,3,3,0x47,0xe6,0x46,0x1a,0x4d,0xf8,0xf0,
         0xe0,0xe0,0xe0,0x80,0xf8,0x70,0xf8,0xf0,0xe0,0xe0,0x60,0x60,0x58,0xb0,0x39,0x7e,0x7c,0x3e,
         0x2f,0x1f,0x1f,0x3c,0x7e,0x1f,0x1f,0x7f,0x6f,0x5f,0x5f,0x7f,0x9c,0x7e,0x3e,0x76,0xf8,0xfc,
         0xc,0xf6,0x7c,0xfe,0xfc,0xf4,0xf8,0xfc,0xfc,0xe,0,3);
  vpatch(rom,0x12400,0x180,1,3,3,7,0x47,0xe1,0x47,0x21,1,3,3,7,0x43,0xe6,0x42,6,0xe0,0xf8,0xfc,0xf0,
         0xe0,0xe0,0xf0,0xe0,0xe0,0xf8,0xfc,0xf0,0xe0,0xf8,0x38,0x70,4,0x1b,0x11,3,7,5,0xe,0xf,0x23,
         0xf,0xe,10,7,7,0xf,0xf,0xe0,0xf0,0xf0,0xd8,0xd8,0xd8,0xc,0x72,0xe0,0xf0,0x70,0x78,0xf8,0xf8
         ,0xfc,0x8e,1,3);
  return;
}

Assistant:

static void dw3_male_wizard(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x30,  0x11);
    vpatch(rom, 0x12300,  128,  0x00,  0x03,  0x03,  0x47,  0xe7,  0x41,  0x5f,  0x0e,  0x00,  0x03,  0x03,  0x47,  0xe6,  0x46,  0x1a,  0x4d,  0xf8,  0xf0,  0xe0,  0xe0,  0xe0,  0x80,  0xf8,  0x70,  0xf8,  0xf0,  0xe0,  0xe0,  0x60,  0x60,  0x58,  0xb0,  0x39,  0x7e,  0x7c,  0x3e,  0x2f,  0x1f,  0x1f,  0x3c,  0x7e,  0x1f,  0x1f,  0x7f,  0x6f,  0x5f,  0x5f,  0x7f,  0x9c,  0x7e,  0x3e,  0x76,  0xf8,  0xfc,  0x0c,  0xf6,  0x7c,  0xfe,  0xfc,  0xf4,  0xf8,  0xfc,  0xfc,  0x0e,  0x00,  0x03,  0x03,  0x07,  0x47,  0xe1,  0x5f,  0x4e,  0x00,  0x03,  0x03,  0x07,  0x46,  0xe6,  0x5a,  0x0d,  0xf8,  0xf0,  0xe0,  0xe0,  0xe0,  0x80,  0xf8,  0x70,  0xf8,  0xf0,  0xe0,  0xe0,  0x60,  0x60,  0x58,  0xb0,  0x19,  0x3e,  0x7c,  0x7e,  0x3f,  0x2f,  0x10,  0x2f,  0x5e,  0x7f,  0x1f,  0x1f,  0x7f,  0x6f,  0x5f,  0x30,  0x9e,  0x7f,  0x3f,  0x7f,  0xfe,  0xf6,  0xf8,  0x3e,  0x7e,  0xf9,  0xf9,  0xff,  0xfe,  0xf6,  0xf8,  0xfe);
    vpatch(rom, 0x12400,  384,  0x01,  0x03,  0x03,  0x07,  0x47,  0xe1,  0x47,  0x21,  0x01,  0x03,  0x03,  0x07,  0x43,  0xe6,  0x42,  0x06,  0xe0,  0xf8,  0xfc,  0xf0,  0xe0,  0xe0,  0xf0,  0xe0,  0xe0,  0xf8,  0xfc,  0xf0,  0xe0,  0xf8,  0x38,  0x70,  0x04,  0x1b,  0x11,  0x03,  0x07,  0x05,  0x0e,  0x0f,  0x23,  0x0f,  0x0e,  0x0a,  0x07,  0x07,  0x0f,  0x0f,  0xe0,  0xf0,  0xf0,  0xd8,  0xd8,  0xd8,  0x0c,  0x72,  0xe0,  0xf0,  0x70,  0x78,  0xf8,  0xf8,  0xfc,  0x8e,  0x01,  0x03,  0x03,  0x27,  0x77,  0x21,  0x27,  0x01,  0x01,  0x03,  0x03,  0x27,  0x73,  0x26,  0x02,  0x26,  0xe0,  0xf8,  0xfc,  0xf0,  0xe0,  0xe0,  0xf0,  0xe0,  0xe0,  0xf8,  0xfc,  0xf0,  0xe0,  0xf8,  0x38,  0x70,  0x0c,  0x3b,  0x31,  0x07,  0x07,  0x0f,  0x08,  0x17,  0x2b,  0x0f,  0x0f,  0x2f,  0x27,  0x2f,  0x2f,  0x38,  0xe0,  0xf0,  0xf8,  0x78,  0x78,  0xb0,  0xcc,  0x3e,  0xe0,  0xf0,  0xc8,  0xc8,  0xf8,  0xf8,  0xfc,  0xfe,  0x07,  0x1f,  0x3f,  0x0f,  0x07,  0x07,  0x0f,  0x07,  0x07,  0x1f,  0x3f,  0x0f,  0x07,  0x1f,  0x1c,  0x0e,  0x80,  0xc0,  0xc0,  0xe8,  0xfc,  0x88,  0xe8,  0x80,  0x80,  0xc0,  0xc0,  0xe8,  0xdc,  0x68,  0x40,  0x68,  0x07,  0x0f,  0x0f,  0x1b,  0x1b,  0x1d,  0x30,  0x4e,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x3f,  0x71,  0x20,  0xf0,  0xb0,  0xe0,  0xe0,  0xa0,  0x70,  0xf0,  0xc8,  0xc8,  0xc8,  0xf8,  0xe8,  0xe8,  0xf8,  0xf8,  0x07,  0x1f,  0x3f,  0x0f,  0x07,  0x07,  0x0f,  0x07,  0x07,  0x1f,  0x3f,  0x0f,  0x07,  0x1f,  0x1c,  0x0e,  0x80,  0xc0,  0xc0,  0xe0,  0xe4,  0x8e,  0xe4,  0x88,  0x80,  0xc0,  0xc0,  0xe0,  0xc4,  0x6e,  0x44,  0x60,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x3b,  0x7c,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x3f,  0x7f,  0x20,  0xc0,  0xe0,  0xe0,  0xa0,  0xb0,  0x10,  0x68,  0xc8,  0xf0,  0x90,  0x90,  0xe0,  0xf0,  0xf0,  0x98,  0x1f,  0x0f,  0x07,  0x07,  0x07,  0x00,  0x03,  0x07,  0x1f,  0x0f,  0x07,  0x07,  0x07,  0x07,  0x1f,  0x0f,  0x00,  0xc0,  0xc0,  0xe2,  0xe7,  0x02,  0xc2,  0xe0,  0x00,  0xc0,  0xc0,  0xe2,  0xe7,  0xe2,  0xf8,  0xf2,  0x3f,  0x7f,  0xff,  0xff,  0x7f,  0x6f,  0x10,  0x6f,  0x3f,  0x7f,  0x9f,  0x9f,  0x7f,  0x6f,  0x1f,  0x70,  0xfc,  0xfe,  0xfe,  0xfe,  0xfa,  0xfc,  0xfc,  0x3e,  0xfe,  0xfe,  0xfc,  0xfc,  0xfa,  0xfe,  0xfe,  0xfe,  0x1f,  0x0f,  0x07,  0x07,  0x07,  0x00,  0x03,  0x07,  0x1f,  0x0f,  0x07,  0x07,  0x07,  0x07,  0x1f,  0x0f,  0x00,  0xc0,  0xc0,  0xe0,  0xe2,  0x07,  0xc2,  0xe2,  0x00,  0xc0,  0xc0,  0xe0,  0xe2,  0xe7,  0xfa,  0xf0,  0x3f,  0x7f,  0x7f,  0x7f,  0x2f,  0x1f,  0x3f,  0x7c,  0x3f,  0x3f,  0x3f,  0x7f,  0x2f,  0x1f,  0x3f,  0x7f,  0xf8,  0xfc,  0xfe,  0xfe,  0xfe,  0xf6,  0x08,  0xf6,  0xfa,  0xfe,  0xfe,  0xfc,  0xfc,  0xf6,  0xfa,  0x0e);
}